

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TreeFormatter.cpp
# Opt level: O0

void __thiscall
cali::TreeFormatter::TreeFormatterImpl::TreeFormatterImpl(TreeFormatterImpl *this,QuerySpec *spec)

{
  QuerySpec *spec_local;
  TreeFormatterImpl *this_local;
  
  SnapshotTree::SnapshotTree(&this->m_tree);
  QuerySpec::QuerySpec(&this->m_spec,spec);
  std::
  map<cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo,_std::less<cali::Attribute>,_std::allocator<std::pair<const_cali::Attribute,_cali::TreeFormatter::TreeFormatterImpl::ColumnInfo>_>_>
  ::map(&this->m_column_info);
  this->m_path_column_width = 0;
  this->m_max_column_width = 0x30;
  std::
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
  ::map(&this->m_aliases);
  this->m_use_nested = true;
  this->m_print_globals = false;
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::vector(&this->m_path_key_names);
  std::vector<cali::Attribute,_std::allocator<cali::Attribute>_>::vector(&this->m_path_keys);
  std::
  vector<cali::TreeFormatter::TreeFormatterImpl::SortInfo,_std::allocator<cali::TreeFormatter::TreeFormatterImpl::SortInfo>_>
  ::vector(&this->m_sort_info);
  std::mutex::mutex(&this->m_path_key_lock);
  configure(this,spec);
  return;
}

Assistant:

TreeFormatterImpl(const QuerySpec& spec)
        : m_spec(spec), m_path_column_width(0), m_max_column_width(48), m_use_nested(true), m_print_globals(false)
    {
        configure(spec);
    }